

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadalloc.h
# Opt level: O2

int snmalloc::CheckInitPthread::pthread_create
              (pthread_t *__newthread,pthread_attr_t *__attr,__start_routine *__start_routine,
              void *__arg)

{
  int iVar1;
  
  pthread_key_create((pthread_key_t *)__newthread,pthread_cleanup);
  iVar1 = atexit(pthread_cleanup_main_thread);
  return iVar1;
}

Assistant:

static void pthread_create(pthread_key_t* key) noexcept
    {
      pthread_key_create(key, &pthread_cleanup);
      // Main thread does not call pthread_cleanup if `main` returns or `exit`
      // is called, so use an atexit handler to guarantee that the cleanup is
      // run at least once.  If the main thread exits with `pthread_exit` then
      // it will be called twice but this case is already handled because other
      // destructors can cause the per-thread allocator to be recreated.
      atexit(&pthread_cleanup_main_thread);
    }